

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

bool density_tests::detail::
     PutString<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  result_type_conflict rVar1;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  param_type local_20;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"hello world!","");
  local_20._M_a = 0;
  local_20._M_b = 1;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_20,&i_rand->m_rand,&local_20);
  if (rVar1 == 0) {
    density::
    conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
    emplace<std::__cxx11::string,std::__cxx11::string&>
              ((conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
                *)queue,&local_40);
  }
  else {
    density::
    conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
    reentrant_emplace<std::__cxx11::string&,std::__cxx11::string&>
              ((conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
                *)queue,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                std::string str("hello world!");
                if (i_rand.get_bool())
                    queue.push(str);
                else
                    queue.reentrant_push(str);
                return true;
            }